

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfB44Compressor.cpp
# Opt level: O1

int __thiscall
Imf_2_5::B44Compressor::compress
          (B44Compressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  long *plVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  ChannelData *pCVar6;
  uint uVar7;
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  int i;
  int iVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  const_iterator cVar15;
  const_iterator cVar16;
  ConstIterator CVar17;
  ushort *__dest;
  unsigned_short *puVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  byte bVar22;
  uint uVar23;
  long lVar24;
  unsigned_short *puVar25;
  unsigned_short *puVar26;
  long lVar27;
  unsigned_short *puVar28;
  uint uVar29;
  long lVar30;
  size_t sVar31;
  int i_2;
  char *pcVar32;
  bool bVar33;
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [16];
  short sVar39;
  short sVar44;
  short sVar45;
  short sVar47;
  undefined4 uVar46;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  ushort uVar48;
  unsigned_short s [16];
  uchar b [2];
  unsigned_short t [16];
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  uint local_f8 [32];
  ulong local_78 [5];
  long local_50;
  unsigned_short *local_48;
  ulong local_40;
  ulong local_38;
  undefined1 auVar37 [16];
  ushort uVar38;
  undefined1 auVar42 [16];
  
  *outPtr = this->_outBuffer;
  if (inSize == 0) {
    return 0;
  }
  iVar13 = (range->min).x;
  iVar19 = (range->max).x;
  if (this->_maxX < iVar19) {
    iVar19 = this->_maxX;
  }
  uVar23 = (range->min).y;
  uVar20 = (range->max).y;
  if (this->_maxY < (int)uVar20) {
    uVar20 = this->_maxY;
  }
  puVar18 = this->_tmpBuffer;
  cVar15._M_node = (_Base_ptr)ChannelList::begin(this->_channels);
  cVar16._M_node = (_Base_ptr)ChannelList::end(this->_channels);
  if (cVar15._M_node != cVar16._M_node) {
    lVar27 = 0;
    do {
      pCVar6 = this->_channelData;
      *(unsigned_short **)((long)&pCVar6->start + lVar27) = puVar18;
      *(unsigned_short **)((long)&pCVar6->end + lVar27) = puVar18;
      iVar11 = numSamples(*(int *)&cVar15._M_node[9].field_0x4,iVar13,iVar19);
      *(int *)((long)&pCVar6->nx + lVar27) = iVar11;
      iVar11 = numSamples(*(int *)&cVar15._M_node[9]._M_parent,uVar23,uVar20);
      *(int *)((long)&pCVar6->ny + lVar27) = iVar11;
      puVar18 = puVar18 + (long)*(int *)((long)&pCVar6->size + lVar27) *
                          (long)iVar11 * (long)*(int *)((long)&pCVar6->nx + lVar27);
      cVar15._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar15._M_node);
      CVar17 = ChannelList::end(this->_channels);
      lVar27 = lVar27 + 0x28;
    } while ((const_iterator)cVar15._M_node != CVar17._i._M_node);
  }
  if (this->_format == XDR) {
    if ((int)uVar23 <= (int)uVar20) {
      do {
        if (0 < this->_numChans) {
          lVar27 = 0;
          do {
            pCVar6 = this->_channelData;
            uVar4 = pCVar6[lVar27].ys;
            if ((int)uVar23 < 0) {
              if (-1 < (int)uVar4) {
                uVar12 = (~uVar23 + uVar4) / uVar4;
                goto LAB_004094e9;
              }
              uVar12 = (~uVar4 - uVar23) / -uVar4;
            }
            else if ((int)uVar4 < 0) {
              uVar12 = uVar23 / -uVar4;
LAB_004094e9:
              uVar12 = -uVar12;
            }
            else {
              uVar12 = uVar23 / uVar4;
            }
            if (uVar23 == uVar12 * uVar4) {
              iVar13 = pCVar6[lVar27].nx;
              if (pCVar6[lVar27].type == HALF) {
                if (0 < iVar13) {
                  puVar18 = pCVar6[lVar27].end;
                  do {
                    pcVar32 = inPtr;
                    lVar24 = 0;
                    do {
                      *(char *)((long)local_f8 + lVar24) = pcVar32[lVar24];
                      lVar24 = lVar24 + 1;
                    } while ((int)lVar24 != 2);
                    *puVar18 = (unsigned_short)local_f8[0];
                    puVar18 = puVar18 + 1;
                    pCVar6[lVar27].end = puVar18;
                    bVar33 = 1 < iVar13;
                    inPtr = pcVar32 + lVar24;
                    iVar13 = iVar13 + -1;
                  } while (bVar33);
                  inPtr = pcVar32 + lVar24;
                }
              }
              else {
                lVar24 = (long)pCVar6[lVar27].size * (long)iVar13;
                memcpy(pCVar6[lVar27].end,inPtr,lVar24 * 2);
                inPtr = inPtr + lVar24 * 2;
                pCVar6[lVar27].end = pCVar6[lVar27].end + lVar24;
              }
            }
            lVar27 = lVar27 + 1;
          } while (lVar27 < this->_numChans);
        }
        bVar33 = uVar23 != uVar20;
        uVar23 = uVar23 + 1;
      } while (bVar33);
    }
  }
  else if ((int)uVar23 <= (int)uVar20) {
    do {
      if (0 < this->_numChans) {
        lVar24 = 8;
        lVar27 = 0;
        do {
          pCVar6 = this->_channelData;
          uVar4 = *(uint *)((long)&pCVar6->nx + lVar24);
          if ((int)uVar23 < 0) {
            if (-1 < (int)uVar4) {
              uVar12 = (~uVar23 + uVar4) / uVar4;
              goto LAB_0040961a;
            }
            uVar12 = (~uVar4 - uVar23) / -uVar4;
          }
          else if ((int)uVar4 < 0) {
            uVar12 = uVar23 / -uVar4;
LAB_0040961a:
            uVar12 = -uVar12;
          }
          else {
            uVar12 = uVar23 / uVar4;
          }
          if (uVar23 == uVar12 * uVar4) {
            lVar30 = (long)*(int *)((long)&pCVar6->type + lVar24) *
                     (long)*(int *)((long)&pCVar6->end + lVar24);
            sVar31 = lVar30 * 2;
            memcpy(*(void **)((long)&pCVar6->start + lVar24),inPtr,sVar31);
            inPtr = inPtr + lVar30 * 2;
            plVar1 = (long *)((long)&pCVar6->start + lVar24);
            *plVar1 = *plVar1 + sVar31;
          }
          lVar27 = lVar27 + 1;
          lVar24 = lVar24 + 0x28;
        } while (lVar27 < this->_numChans);
      }
      bVar33 = uVar23 != uVar20;
      uVar23 = uVar23 + 1;
    } while (bVar33);
  }
  __dest = (ushort *)this->_outBuffer;
  if (0 < this->_numChans) {
    local_50 = 0;
    do {
      pCVar6 = this->_channelData + local_50;
      if (pCVar6->type == HALF) {
        iVar13 = pCVar6->ny;
        if (0 < iVar13) {
          uVar23 = 0;
          do {
            lVar27 = (long)pCVar6->nx;
            puVar25 = pCVar6->start + lVar27 * (int)uVar23;
            puVar18 = puVar25 + lVar27;
            puVar28 = puVar18 + lVar27;
            if ((int)(uVar23 | 3) < iVar13) {
              puVar26 = puVar28 + lVar27;
            }
            else {
              if (iVar13 <= (int)(uVar23 | 1)) {
                puVar18 = puVar25;
              }
              puVar26 = puVar28;
              if (iVar13 <= (int)(uVar23 | 2)) {
                puVar26 = puVar18;
                puVar28 = puVar18;
              }
            }
            iVar13 = pCVar6->nx;
            if (0 < iVar13) {
              uVar20 = 0;
              do {
                if ((int)(uVar20 | 3) < iVar13) {
                  local_118 = *(undefined8 *)puVar25;
                  local_110 = *(undefined8 *)puVar18;
                  local_108 = *(undefined8 *)puVar28;
                  local_100 = *(undefined8 *)puVar26;
                }
                else {
                  lVar27 = 0;
                  do {
                    iVar19 = (int)lVar27;
                    if ((int)(iVar13 + ~uVar20) < (int)lVar27) {
                      iVar19 = iVar13 + ~uVar20;
                    }
                    *(unsigned_short *)((long)&local_118 + lVar27 * 2) = puVar25[iVar19];
                    *(unsigned_short *)((long)&local_110 + lVar27 * 2) = puVar18[iVar19];
                    *(unsigned_short *)((long)&local_108 + lVar27 * 2) = puVar28[iVar19];
                    *(unsigned_short *)((long)&local_100 + lVar27 * 2) = puVar26[iVar19];
                    lVar27 = lVar27 + 1;
                  } while (lVar27 != 4);
                }
                bVar33 = pCVar6->pLinear;
                if (bVar33 == true) {
                  lVar27 = 0;
                  do {
                    *(undefined2 *)((long)&local_118 + lVar27 * 2) =
                         *(undefined2 *)
                          ((anonymous_namespace)::expTable +
                          (ulong)*(ushort *)((long)&local_118 + lVar27 * 2) * 2);
                    lVar27 = lVar27 + 1;
                  } while (lVar27 != 0x10);
                }
                puVar25 = puVar25 + 4;
                puVar18 = puVar18 + 4;
                puVar28 = puVar28 + 4;
                puVar26 = puVar26 + 4;
                bVar3 = this->_optFlatFields;
                lVar27 = 0;
                do {
                  uVar38 = *(ushort *)((long)&local_118 + lVar27 * 2);
                  if ((~uVar38 & 0x7c00) == 0) {
                    *(undefined2 *)((long)local_78 + lVar27 * 2) = 0x8000;
                  }
                  else {
                    if ((short)uVar38 < 0) {
                      uVar38 = ~uVar38;
                    }
                    else {
                      uVar38 = uVar38 | 0x8000;
                    }
                    *(ushort *)((long)local_78 + lVar27 * 2) = uVar38;
                  }
                  lVar27 = lVar27 + 1;
                } while (lVar27 != 0x10);
                lVar27 = 0;
                auVar41 = (undefined1  [16])0x0;
                do {
                  auVar36 = psubusw(*(undefined1 (*) [16])((long)local_78 + lVar27 * 2),auVar41);
                  auVar34._0_2_ = auVar36._0_2_ + auVar41._0_2_;
                  auVar34._2_2_ = auVar36._2_2_ + auVar41._2_2_;
                  auVar34._4_2_ = auVar36._4_2_ + auVar41._4_2_;
                  auVar34._6_2_ = auVar36._6_2_ + auVar41._6_2_;
                  auVar34._8_2_ = auVar36._8_2_ + auVar41._8_2_;
                  auVar34._10_2_ = auVar36._10_2_ + auVar41._10_2_;
                  auVar37._12_2_ = auVar36._12_2_ + auVar41._12_2_;
                  auVar37._0_12_ = auVar34;
                  auVar37._14_2_ = auVar36._14_2_ + auVar41._14_2_;
                  lVar27 = lVar27 + 8;
                  auVar41 = auVar37;
                } while (lVar27 != 0x10);
                auVar40._4_4_ = auVar37._12_4_;
                auVar40._0_4_ = auVar34._8_4_;
                auVar40._8_4_ = auVar34._8_4_;
                auVar40._12_4_ = auVar37._12_4_;
                auVar41 = psubusw(auVar40,auVar37);
                sVar39 = auVar41._0_2_ + auVar34._0_2_;
                sVar44 = auVar41._2_2_ + auVar34._2_2_;
                sVar45 = auVar41._4_2_ + auVar34._4_2_;
                sVar47 = auVar41._6_2_ + auVar34._6_2_;
                auVar42._0_8_ = CONCAT26(sVar47,CONCAT24(sVar45,CONCAT22(sVar44,sVar39)));
                auVar42._8_2_ = auVar41._8_2_ + auVar34._8_2_;
                auVar42._10_2_ = auVar41._10_2_ + auVar34._10_2_;
                auVar42._12_2_ = auVar41._12_2_ + auVar37._12_2_;
                auVar42._14_2_ = auVar41._14_2_ + auVar37._14_2_;
                uVar46 = (undefined4)((ulong)auVar42._0_8_ >> 0x20);
                auVar41._4_4_ = uVar46;
                auVar41._0_4_ = uVar46;
                auVar41._8_4_ = uVar46;
                auVar41._12_4_ = uVar46;
                auVar41 = psubusw(auVar41,auVar42);
                sVar39 = auVar41._0_2_ + sVar39;
                uVar38 = auVar41._2_2_ + sVar44;
                auVar35._0_8_ =
                     CONCAT26(auVar41._6_2_ + sVar47,
                              CONCAT24(auVar41._4_2_ + sVar45,CONCAT22(uVar38,sVar39)));
                auVar35._8_2_ = auVar41._8_2_ + auVar42._8_2_;
                auVar35._10_2_ = auVar41._10_2_ + auVar42._10_2_;
                auVar36._12_2_ = auVar41._12_2_ + auVar42._12_2_;
                auVar36._0_12_ = auVar35;
                auVar36._14_2_ = auVar41._14_2_ + auVar42._14_2_;
                auVar43._2_2_ = 0;
                auVar43._0_2_ = uVar38;
                auVar43._4_4_ = (uint)((ulong)auVar35._0_8_ >> 0x30);
                auVar43._8_4_ = auVar35._8_4_ >> 0x10;
                auVar43._12_4_ = auVar36._12_4_ >> 0x10;
                auVar41 = psubusw(auVar43,auVar36);
                uVar38 = auVar41._0_2_ + sVar39;
                uVar4 = (uint)uVar38;
                iVar13 = -1;
                do {
                  iVar19 = iVar13 + 1;
                  bVar22 = (byte)iVar19;
                  uVar12 = iVar13 + 2;
                  uVar21 = ~(-1 << (bVar22 & 0x1f));
                  lVar27 = 0;
                  do {
                    uVar2 = *(ulong *)((long)local_78 + lVar27 * 2);
                    uVar48 = (ushort)(uVar2 >> 0x30);
                    auVar8._8_4_ = 0;
                    auVar8._0_8_ = uVar2;
                    auVar8._12_2_ = uVar48;
                    auVar9._8_2_ = (short)(uVar2 >> 0x20);
                    auVar9._0_8_ = uVar2;
                    auVar9._10_4_ = auVar8._10_4_;
                    auVar10._6_8_ = 0;
                    auVar10._0_6_ = auVar9._8_6_;
                    uVar14 = (uVar4 - (ushort)uVar2) * 2;
                    uVar29 = (uVar4 - (int)CONCAT82(SUB148(auVar10 << 0x40,6),(short)(uVar2 >> 0x10)
                                                   )) * 2;
                    uVar5 = (uVar4 - auVar9._8_4_) * 2;
                    uVar7 = (uVar4 - uVar48) * 2;
                    uVar2 = (ulong)uVar12;
                    local_f8[lVar27] =
                         (int)(uVar14 + uVar21 + (uVar14 >> uVar2 & 1)) >> ZEXT416(uVar12);
                    local_f8[lVar27 + 1] =
                         (int)(uVar29 + uVar21 + (uVar29 >> uVar2 & 1)) >> ZEXT416(uVar12);
                    local_f8[lVar27 + 2] =
                         (int)(uVar5 + uVar21 + (uVar5 >> uVar2 & 1)) >> ZEXT416(uVar12);
                    local_f8[lVar27 + 3] =
                         (int)(uVar7 + uVar21 + (uVar7 >> uVar2 & 1)) >> ZEXT416(uVar12);
                    lVar27 = lVar27 + 4;
                  } while (lVar27 != 0x10);
                  uVar29 = local_f8[0] - local_f8[4];
                  local_40 = (ulong)uVar29;
                  uVar14 = local_f8[4] - local_f8[8];
                  local_38 = (ulong)uVar14;
                  local_f8[0x11] = uVar14 + 0x20;
                  local_f8[0x12] = (local_f8[8] - local_f8[0xc]) + 0x20;
                  local_f8[0x13] = (local_f8[0] - local_f8[1]) + 0x20;
                  local_f8[0x14] = (local_f8[4] - local_f8[5]) + 0x20;
                  local_f8[0x15] = (local_f8[8] - local_f8[9]) + 0x20;
                  local_f8[0x16] = (local_f8[0xc] - local_f8[0xd]) + 0x20;
                  local_f8[0x17] = (local_f8[1] - local_f8[2]) + 0x20;
                  local_f8[0x18] = (local_f8[5] - local_f8[6]) + 0x20;
                  local_f8[0x19] = (local_f8[9] - local_f8[10]) + 0x20;
                  local_f8[0x1a] = (local_f8[0xd] - local_f8[0xe]) + 0x20;
                  local_f8[0x1b] = (local_f8[2] - local_f8[3]) + 0x20;
                  local_f8[0x1c] = (local_f8[6] - local_f8[7]) + 0x20;
                  local_f8[0x1d] = (local_f8[10] - local_f8[0xb]) + 0x20;
                  local_f8[0x1e] = (local_f8[0xe] - local_f8[0xf]) + 0x20;
                  local_f8[0x10] = uVar29 + 0x20;
                  lVar27 = 1;
                  uVar12 = local_f8[0x10];
                  uVar21 = local_f8[0x10];
                  do {
                    uVar5 = local_f8[lVar27 + 0x10];
                    if ((int)uVar5 <= (int)uVar21) {
                      uVar21 = uVar5;
                    }
                    if ((int)uVar5 < (int)uVar12) {
                      uVar5 = uVar12;
                    }
                    uVar12 = uVar5;
                    lVar27 = lVar27 + 1;
                  } while (lVar27 != 0xf);
                  iVar13 = iVar19;
                } while (((int)uVar21 < 0) || (0x3f < (int)uVar12));
                if ((uVar21 == 0x20) && ((uVar12 == 0x20 && (bVar3 != false)))) {
                  *__dest = (ushort)local_78[0] << 8 | (ushort)local_78[0] >> 8;
                  lVar27 = 3;
                  bVar22 = 0xfc;
                  lVar24 = 2;
                }
                else {
                  if (bVar33 == false) {
                    local_78[0]._0_2_ = uVar38 - (short)(local_f8[0] << (bVar22 & 0x1f));
                  }
                  *(char *)__dest = (char)((ushort)local_78[0] >> 8);
                  *(char *)((long)__dest + 1) = (char)(ushort)local_78[0];
                  *(byte *)(__dest + 1) = (byte)(local_f8[0x10] >> 4) | bVar22 * '\x04';
                  *(byte *)((long)__dest + 3) = (byte)(uVar14 + 0x20 >> 2) | (char)uVar29 * '\x10';
                  *(byte *)(__dest + 2) = (byte)local_f8[0x12] | (char)uVar14 * '@';
                  *(byte *)((long)__dest + 5) =
                       (byte)(local_f8[0x14] >> 4) | (char)local_f8[0x13] * '\x04';
                  *(byte *)(__dest + 3) =
                       (byte)(local_f8[0x15] >> 2) | (char)(local_f8[4] - local_f8[5]) * '\x10';
                  *(byte *)((long)__dest + 7) =
                       (byte)local_f8[0x16] | (char)(local_f8[8] - local_f8[9]) * '@';
                  *(byte *)(__dest + 4) =
                       (byte)(local_f8[0x18] >> 4) | (char)local_f8[0x17] * '\x04';
                  *(byte *)((long)__dest + 9) =
                       (byte)(local_f8[0x19] >> 2) | (char)(local_f8[5] - local_f8[6]) * '\x10';
                  *(byte *)(__dest + 5) =
                       (byte)local_f8[0x1a] | (char)(local_f8[9] - local_f8[10]) * '@';
                  *(byte *)((long)__dest + 0xb) =
                       (byte)(local_f8[0x1c] >> 4) | (char)local_f8[0x1b] * '\x04';
                  *(byte *)(__dest + 6) =
                       (byte)(local_f8[0x1d] >> 2) | (char)(local_f8[6] - local_f8[7]) * '\x10';
                  bVar22 = (byte)local_f8[0x1e] | (char)(local_f8[10] - local_f8[0xb]) * '@';
                  lVar27 = 0xe;
                  lVar24 = 0xd;
                }
                *(byte *)((long)__dest + lVar24) = bVar22;
                __dest = (ushort *)(lVar27 + (long)__dest);
                uVar20 = uVar20 + 4;
                iVar13 = pCVar6->nx;
                local_48 = puVar26;
              } while ((int)uVar20 < iVar13);
            }
            uVar23 = uVar23 + 4;
            iVar13 = pCVar6->ny;
          } while ((int)uVar23 < iVar13);
        }
      }
      else {
        sVar31 = (size_t)(pCVar6->nx * pCVar6->ny * pCVar6->size * 2);
        memcpy(__dest,pCVar6->start,sVar31);
        __dest = (ushort *)((long)__dest + sVar31);
      }
      local_50 = local_50 + 1;
    } while (local_50 < this->_numChans);
  }
  return (int)__dest - *(int *)&this->_outBuffer;
}

Assistant:

int
B44Compressor::compress (const char *inPtr,
			 int inSize,
			 IMATH_NAMESPACE::Box2i range,
			 const char *&outPtr)
{
    //
    // Compress a block of pixel data:  First copy the input pixels
    // from the input buffer into _tmpBuffer, rearranging them such
    // that blocks of 4x4 pixels of a single channel can be accessed
    // conveniently.  Then compress each 4x4 block of HALF pixel data
    // and append the result to the output buffer.  Copy UINT and
    // FLOAT data to the output buffer without compressing them.
    //

    outPtr = _outBuffer;

    if (inSize == 0)
    {
	//
	// Special case - empty input buffer.
	//

	return 0;
    }

    //
    // For each channel, detemine how many pixels are stored
    // in the input buffer, and where those pixels will be
    // placed in _tmpBuffer.
    //

    int minX = range.min.x;
    int maxX = min (range.max.x, _maxX);
    int minY = range.min.y;
    int maxY = min (range.max.y, _maxY);
    
    unsigned short *tmpBufferEnd = _tmpBuffer;
    int i = 0;

    for (ChannelList::ConstIterator c = _channels.begin();
	 c != _channels.end();
	 ++c, ++i)
    {
	ChannelData &cd = _channelData[i];

	cd.start = tmpBufferEnd;
	cd.end = cd.start;

	cd.nx = numSamples (c.channel().xSampling, minX, maxX);
	cd.ny = numSamples (c.channel().ySampling, minY, maxY);

	tmpBufferEnd += cd.nx * cd.ny * cd.size;
    }

    if (_format == XDR)
    {
	//
	// The data in the input buffer are in the machine-independent
	// Xdr format.  Copy the HALF channels into _tmpBuffer and
	// convert them back into native format for compression.
	// Copy UINT and FLOAT channels verbatim into _tmpBuffer.
	//

	for (int y = minY; y <= maxY; ++y)
	{
	    for (int i = 0; i < _numChans; ++i)
	    {
		ChannelData &cd = _channelData[i];

		if (modp (y, cd.ys) != 0)
		    continue;

		if (cd.type == HALF)
		{
		    for (int x = cd.nx; x > 0; --x)
		    {
			Xdr::read <CharPtrIO> (inPtr, *cd.end);
			++cd.end;
		    }
		}
		else
		{
		    int n = cd.nx * cd.size;
		    memcpy (cd.end, inPtr, n * sizeof (unsigned short));
		    inPtr += n * sizeof (unsigned short);
		    cd.end += n;
		}
	    }
	}
    }
    else
    {
	//
	// The input buffer contains only HALF channels, and they
	// are in native, machine-dependent format.  Copy the pixels
	// into _tmpBuffer.
	//

	for (int y = minY; y <= maxY; ++y)
	{
	    for (int i = 0; i < _numChans; ++i)
	    {
		ChannelData &cd = _channelData[i];

		#if defined (DEBUG)
		    assert (cd.type == HALF);
		#endif

		if (modp (y, cd.ys) != 0)
		    continue;

		int n = cd.nx * cd.size;
		memcpy (cd.end, inPtr, n * sizeof (unsigned short));
		inPtr  += n * sizeof (unsigned short);
		cd.end += n;
	    }
	}
    }

    //
    // The pixels for each channel have been packed into a contiguous
    // block in _tmpBuffer.  HALF channels are in native format; UINT
    // and FLOAT channels are in Xdr format.
    //

    #if defined (DEBUG)

	for (int i = 1; i < _numChans; ++i)
	    assert (_channelData[i-1].end == _channelData[i].start);

	assert (_channelData[_numChans-1].end == tmpBufferEnd);

    #endif

    //
    // For each HALF channel, split the data in _tmpBuffer into 4x4
    // pixel blocks.  Compress each block and append the compressed
    // data to the output buffer.
    //
    // UINT and FLOAT channels are copied from _tmpBuffer into the
    // output buffer without further processing.
    //

    char *outEnd = _outBuffer;

    for (int i = 0; i < _numChans; ++i)
    {
	ChannelData &cd = _channelData[i];
	
	if (cd.type != HALF)
	{
	    //
	    // UINT or FLOAT channel.
	    //

	    int n = cd.nx * cd.ny * cd.size * sizeof (unsigned short);
	    memcpy (outEnd, cd.start, n);
	    outEnd += n;

	    continue;
	}
	
	//
	// HALF channel
	//

	for (int y = 0; y < cd.ny; y += 4)
	{
	    //
	    // Copy the next 4x4 pixel block into array s.
	    // If the width, cd.nx, or the height, cd.ny, of
	    // the pixel data in _tmpBuffer is not divisible
	    // by 4, then pad the data by repeating the
	    // rightmost column and the bottom row.
	    // 

	    unsigned short *row0 = cd.start + y * cd.nx;
	    unsigned short *row1 = row0 + cd.nx;
	    unsigned short *row2 = row1 + cd.nx;
	    unsigned short *row3 = row2 + cd.nx;

	    if (y + 3 >= cd.ny)
	    {
		if (y + 1 >= cd.ny)
		    row1 = row0;

		if (y + 2 >= cd.ny)
		    row2 = row1;

		row3 = row2;
	    }

	    for (int x = 0; x < cd.nx; x += 4)
	    {
		unsigned short s[16];

		if (x + 3 >= cd.nx)
		{
		    int n = cd.nx - x;

		    for (int i = 0; i < 4; ++i)
		    {
			int j = min (i, n - 1);

			s[i +  0] = row0[j];
			s[i +  4] = row1[j];
			s[i +  8] = row2[j];
			s[i + 12] = row3[j];
		    }
		}
		else
		{
		    memcpy (&s[ 0], row0, 4 * sizeof (unsigned short));
		    memcpy (&s[ 4], row1, 4 * sizeof (unsigned short));
		    memcpy (&s[ 8], row2, 4 * sizeof (unsigned short));
		    memcpy (&s[12], row3, 4 * sizeof (unsigned short));
		}

		row0 += 4;
		row1 += 4;
		row2 += 4;
		row3 += 4;

		//
		// Compress the contents of array s and append the
		// results to the output buffer.
		//

		if (cd.pLinear)
		    convertFromLinear (s);

		outEnd += pack (s, (unsigned char *) outEnd,
				_optFlatFields, !cd.pLinear);
	    }
	}
    }

    return outEnd - _outBuffer;
}